

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_dense.c
# Opt level: O2

void SUNMatDestroy_Dense(SUNMatrix A)

{
  void *__ptr;
  
  if (A != (SUNMatrix)0x0) {
    __ptr = A->content;
    if (__ptr != (void *)0x0) {
      if (*(void **)((long)__ptr + 0x10) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x10));
        __ptr = A->content;
        *(undefined8 *)((long)__ptr + 0x10) = 0;
      }
      if (*(void **)((long)__ptr + 0x20) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x20));
        __ptr = A->content;
        *(undefined8 *)((long)__ptr + 0x20) = 0;
      }
      free(__ptr);
      A->content = (void *)0x0;
    }
    free(A->ops);
    free(A);
    return;
  }
  return;
}

Assistant:

void SUNMatDestroy_Dense(SUNMatrix A)
{
  if (A == NULL) { return; }

  /* free content */
  if (A->content != NULL)
  {
    /* free data array */
    if (SM_DATA_D(A) != NULL)
    {
      free(SM_DATA_D(A));
      SM_DATA_D(A) = NULL;
    }
    /* free column pointers */
    if (SM_CONTENT_D(A)->cols != NULL)
    {
      free(SM_CONTENT_D(A)->cols);
      SM_CONTENT_D(A)->cols = NULL;
    }
    /* free content struct */
    free(A->content);
    A->content = NULL;
  }

  /* free ops and matrix */
  if (A->ops)
  {
    free(A->ops);
    A->ops = NULL;
  }
  free(A);
  A = NULL;

  return;
}